

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerMSL::emit_mesh_tasks(CompilerMSL *this,SPIRBlock *block)

{
  uint32_t uVar1;
  uint32_t id;
  undefined1 local_88 [48];
  undefined1 local_58 [32];
  SPIRBlock *local_18;
  SPIRBlock *block_local;
  CompilerMSL *this_local;
  
  local_18 = block;
  block_local = (SPIRBlock *)this;
  CompilerGLSL::flush_variable_declaration(&this->super_CompilerGLSL,this->builtin_task_grid_id);
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_18->mesh);
  id = (uint32_t)this;
  CompilerGLSL::to_unpacked_expression_abi_cxx11_
            ((CompilerGLSL *)&stack0xffffffffffffffc8,id,SUB41(uVar1,0));
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)((local_18->mesh).groups + 1));
  CompilerGLSL::to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_58,id,SUB41(uVar1,0));
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)((local_18->mesh).groups + 2));
  CompilerGLSL::to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_88,id,SUB41(uVar1,0));
  CompilerGLSL::
  statement<char_const(&)[40],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[4]>
            (&this->super_CompilerGLSL,(char (*) [40])"spvMgp.set_threadgroups_per_grid(uint3(",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffc8,(char (*) [3])0x421228,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             (char (*) [3])0x421228,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
             (char (*) [4])0x41e810);
  ::std::__cxx11::string::~string((string *)local_88);
  ::std::__cxx11::string::~string((string *)local_58);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  CompilerGLSL::statement<char_const(&)[8]>(&this->super_CompilerGLSL,(char (*) [8])0x4248e6);
  return;
}

Assistant:

void CompilerMSL::emit_mesh_tasks(SPIRBlock &block)
{
	// GLSL: Once this instruction is called, the workgroup must be terminated immediately, and the mesh shaders are launched.
	// TODO: find relieble and clean of terminating shader.
	flush_variable_declaration(builtin_task_grid_id);
	statement("spvMgp.set_threadgroups_per_grid(uint3(", to_unpacked_expression(block.mesh.groups[0]), ", ",
	          to_unpacked_expression(block.mesh.groups[1]), ", ", to_unpacked_expression(block.mesh.groups[2]), "));");
	// This is correct if EmitMeshTasks is called in the entry function for shader.
	// Only viable solutions would be:
	// - Caller ensures the SPIR-V is inlined, then this always holds true.
	// - Pass down a "should terminate" bool to leaf functions and chain return (horrible and disgusting, let's not).
	statement("return;");
}